

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::RegionHandler::handleRemap
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          RegionHandler *this,Vector3d *position,int numberOfChannels)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  VectorXd out;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  VectorXd _pv;
  type local_88;
  long lStack_80;
  char local_78 [8];
  DenseStorage<double,__1,__1,_1,_0> local_70;
  DenseStorage<double,__1,__1,_1,_0> local_60;
  long local_50 [2];
  undefined8 local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  double local_28;
  
  local_38 = *(undefined4 *)
              (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array;
  uStack_34 = *(undefined4 *)
               ((long)(position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array + 4);
  uStack_30 = *(undefined4 *)
               ((position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array + 1);
  uStack_2c = *(undefined4 *)
               ((long)(position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array + 0xc);
  local_28 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  (**this->_vptr_RegionHandler)(local_78,this,&local_38);
  if (local_78[0] == '\x01') {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_60,&local_70);
    local_50[0] = (long)numberOfChannels;
    local_40 = 0;
    if (numberOfChannels < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_88,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_50);
    if (0 < local_60.m_rows) {
      piVar1 = (this->_outputChannels).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      lVar2 = (this->_outputChannels).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      lVar3 = 0;
      if (lVar2 < 1) {
        lVar2 = lVar3;
      }
      do {
        if (lVar2 == lVar3) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<int, -1, 1>, Level = 0]"
                       );
        }
        lVar4 = (long)piVar1[lVar3];
        if ((lVar4 < 0) || (lStack_80 <= lVar4)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        *(double *)((long)local_88 + lVar4 * 8) = local_60.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (local_60.m_rows != lVar3);
    }
    (__return_storage_ptr__->super_type).m_initialized = false;
    (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ = local_88;
    *(long *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) = lStack_80;
    local_88 = (type)0x0;
    lStack_80 = 0;
    (__return_storage_ptr__->super_type).m_initialized = true;
    free(local_60.m_data);
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  if (local_78[0] == '\x01') {
    free(local_70.m_data);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> RegionHandler::handleRemap(
      Eigen::Vector3d position, int numberOfChannels) const {
    boost::optional<Eigen::VectorXd> pv = handle(position);

    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      Eigen::VectorXd out = Eigen::VectorXd::Zero(numberOfChannels);
      for (int i = 0; i < _pv.size(); ++i) {
        out(_outputChannels(i)) = _pv(i);
      }
      return out;
    }
    return boost::none;
  }